

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O1

pair<double,_double> __thiscall
ear::ScreenEdgeLockHandler::handleAzimuthElevation
          (ScreenEdgeLockHandler *this,double azimuth,double elevation,
          ScreenEdgeLock *screenEdgeLock)

{
  not_implemented *this_00;
  pair<double,_double> pVar1;
  string local_40;
  
  if (((screenEdgeLock->horizontal).super_type.m_initialized == false) &&
     ((screenEdgeLock->vertical).super_type.m_initialized != true)) {
    pVar1.second = elevation;
    pVar1.first = azimuth;
    return pVar1;
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"screenEdgeLock","");
  not_implemented::not_implemented(this_00,&local_40);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<double, double> handleAzimuthElevation(
        double azimuth, double elevation, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_pair(azimuth, elevation);
    }